

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

uint fmt::internal::parse_nonnegative_int<char>(char **s)

{
  char *pcVar1;
  uint uVar2;
  FormatError *this;
  char *pcVar3;
  
  if (9 < (byte)(**s - 0x30U)) {
    __assert_fail("\'0\' <= *s && *s <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/format.h"
                  ,0xeb0,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&) [Char = char]");
  }
  uVar2 = 0;
  pcVar1 = *s;
  do {
    pcVar3 = pcVar1 + 1;
    if (0xccccccc < uVar2) {
      uVar2 = 0x80000000;
      break;
    }
    uVar2 = ((int)*pcVar1 + uVar2 * 10) - 0x30;
    *s = pcVar3;
    pcVar1 = pcVar3;
  } while ((byte)(*pcVar3 - 0x30U) < 10);
  if ((int)uVar2 < 0) {
    this = (FormatError *)__cxa_allocate_exception(0x10);
    FormatError::FormatError(this,(CStringRef)0x12c6ca);
    __cxa_throw(this,&FormatError::typeinfo,std::runtime_error::~runtime_error);
  }
  return uVar2;
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + (*s - '0');
    ++s;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}